

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O2

void SpiritKarma<unsigned_int>(void)

{
  long lVar1;
  ostream *poVar2;
  undefined1 local_98 [8];
  char buf [64];
  ResultType _result;
  Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> _prof;
  char *beg;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"[");
  poVar2 = std::operator<<(poVar2,___gxx_personality_v0 + (*___gxx_personality_v0 == '*'));
  poVar2 = std::operator<<(poVar2,"] ");
  poVar2 = std::operator<<(poVar2,"spirit karma");
  std::operator<<(poVar2,"... ");
  std::ostream::flush();
  _result.__r = (rep)(buf + 0x38);
  _prof.mResult = (duration<double,_std::ratio<1L,_1L>_> *)std::chrono::_V2::steady_clock::now();
  for (beg._4_4_ = 0; beg._4_4_ != -1; beg._4_4_ = beg._4_4_ + 1) {
    _prof.mStart.__d.__r = (duration)(duration)local_98;
    boost::spirit::karma::
    generate<char*,boost::spirit::terminal<boost::spirit::tag::auto_>,unsigned_int>
              ((char **)&_prof.mStart,(terminal<boost::spirit::tag::auto_> *)&boost::spirit::auto_,
               (uint *)((long)&beg + 4));
    *(undefined1 *)_prof.mStart.__d.__r = 0;
  }
  Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>::~Profiler
            ((Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *)&_result);
  lVar1 = std::cout;
  *(uint *)(std::locale::classic + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::locale::classic + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) = 3;
  poVar2 = std::ostream::_M_insert<double>((double)buf._56_8_);
  poVar2 = std::operator<<(poVar2,"s");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void SpiritKarma()
{
    char buf[64];
    PROFILING_BEGIN(T, "spirit karma")
    char *beg = buf;
    boost::spirit::karma::generate(beg, boost::spirit::karma::auto_, i);
    *beg = 0;
    PROFILING_END()
}